

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O0

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::SetSideOrder
          (TPZCompElH1<pzshape::TPZShapePrism> *this,int side,int order)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this_00;
  long *plVar5;
  undefined4 extraout_var;
  TPZConnect *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TPZCompMesh *this_02;
  int64_t iVar6;
  TPZCompElSide *this_03;
  TPZCompEl *pTVar7;
  undefined4 extraout_var_03;
  uint in_EDX;
  uint in_ESI;
  TPZBlock *in_RDI;
  int neworder;
  TPZInterpolatedElement *intel;
  int64_t eq;
  int64_t neq;
  TPZCompEl *in_stack_00000060;
  TPZStack<TPZCompElSide,_10> equal;
  TPZGeoElSide gelside;
  int nshape;
  TPZMaterial *mat;
  int nvar;
  int64_t seqnum;
  int previousconnectorder;
  TPZConnect *c;
  int prevorder;
  size_t in_stack_00000298;
  char *in_stack_000002a0;
  undefined8 in_stack_fffffffffffffe78;
  TPZConnect *in_stack_fffffffffffffe80;
  TPZGeoEl *in_stack_fffffffffffffe88;
  TPZGeoElSide *in_stack_fffffffffffffe90;
  TPZConnect *this_04;
  int pos;
  int in_stack_fffffffffffffea0;
  int local_14c;
  int64_t local_140;
  TPZVec<TPZCompElSide> local_120 [5];
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  TPZStack<TPZCompElSide,_10> *in_stack_ffffffffffffff88;
  TPZGeoElSide *in_stack_ffffffffffffff90;
  int local_14;
  undefined4 extraout_var_00;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if ((((int)in_ESI < 0) || (0x14 < (int)in_ESI)) || ((5 < (int)in_ESI && ((int)in_EDX < 1)))) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"TPZIntelGen::SetSideOrder. Bad paramenter side "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_ESI);
    poVar4 = std::operator<<(poVar4," order ");
    this_00 = (void *)std::ostream::operator<<(poVar4,in_EDX);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000002a0,in_stack_00000298);
  }
  else if ((5 < (int)in_ESI) &&
          (plVar5 = TPZVec<long>::operator[]
                              ((TPZVec<long> *)&(in_RDI->fBlock).fExtAlloc[4].pos,(long)(int)in_ESI)
          , *plVar5 != -1)) {
    local_14 = *(int *)&(in_RDI->fBlock).fExtAlloc[0].super_TPZSavable._vptr_TPZSavable;
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x14])(in_RDI,0x14);
    if (CONCAT44(extraout_var,iVar2) != -1) {
      local_14 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x67])(in_RDI,0x14);
    }
    iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x15])(in_RDI,(ulong)in_ESI);
    this_01 = (TPZConnect *)CONCAT44(extraout_var_00,iVar2);
    bVar1 = TPZConnect::Order(this_01);
    if (in_EDX != bVar1) {
      this_04 = this_01;
      iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x14])(in_RDI,(ulong)in_ESI);
      TPZConnect::SetOrder(this_04,in_EDX,CONCAT44(extraout_var_01,iVar2));
      pos = (int)((ulong)this_04 >> 0x20);
      TPZConnect::SequenceNumber(this_01);
      iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x17])();
      if ((long *)CONCAT44(extraout_var_02,iVar2) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x78))();
      }
      iVar2 = pzshape::TPZShapePrism::NConnectShapeF((int)in_stack_fffffffffffffe80,iVar3);
      TPZConnect::SetNShape(this_01,iVar2);
      TPZConnect::SetNState(in_stack_fffffffffffffe80,iVar3);
      iVar3 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      this_02 = TPZCompEl::Mesh(in_stack_00000060);
      TPZCompMesh::Block(this_02);
      TPZBlock::Set(in_RDI,in_EDX,in_stack_fffffffffffffea0,pos);
      TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe88);
      TPZGeoElSide::TPZGeoElSide(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,iVar3);
      TPZStack<TPZCompElSide,_10>::TPZStack
                ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffe90);
      TPZGeoElSide::EqualLevelCompElementList
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff80);
      iVar6 = TPZVec<TPZCompElSide>::size(local_120);
      for (local_140 = 0; local_140 < iVar6; local_140 = local_140 + 1) {
        this_03 = TPZVec<TPZCompElSide>::operator[](local_120,local_140);
        pTVar7 = TPZCompElSide::Element(this_03);
        if (pTVar7 == (TPZCompEl *)0x0) {
          plVar5 = (long *)0x0;
        }
        else {
          plVar5 = (long *)__dynamic_cast(pTVar7,&TPZCompEl::typeinfo,
                                          &TPZInterpolatedElement::typeinfo,0);
        }
        (**(code **)(*plVar5 + 0x270))();
      }
      TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1c0b591);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1c0b59e);
    }
    local_14c = local_14;
    iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x14])(in_RDI,0x14);
    if (CONCAT44(extraout_var_03,iVar3) != -1) {
      local_14c = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x67])(in_RDI,0x14);
    }
    if (local_14c != local_14) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4e])();
    }
  }
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SetSideOrder(int side, int order) {
	if(side<0 || side >= TSHAPE::NSides || (side >= TSHAPE::NCornerNodes && order <1)) {
		PZError << "TPZIntelGen::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
		DebugStop();
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_ERROR(logger,sout.str())
#endif
		return;
	}
	if(side>= TSHAPE::NCornerNodes) {
		if(fConnectIndexes[side] == -1) return;
        int prevorder = this->fPreferredOrder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            prevorder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		TPZConnect &c = this->Connect(side);
        int previousconnectorder = c.Order();
        if (order != previousconnectorder)
        {
            c.SetOrder(order,this->ConnectIndex(side));
            int64_t seqnum = c.SequenceNumber();
            int nvar = 1;
            TPZMaterial * mat = this->Material();
            if(mat) nvar = mat->NStateVariables();
            int nshape = TSHAPE::NConnectShapeF(side, order);
            c.SetNShape(nshape);
            c.SetNState(nvar);
            this->Mesh()->Block().Set(seqnum,nshape*nvar);
            TPZGeoElSide gelside(this->Reference(),side);
            TPZStack<TPZCompElSide> equal;
            gelside.EqualLevelCompElementList(equal, 1, 0);
            int64_t neq = equal.size();
            for (int64_t eq=0; eq<neq; eq++) {
                TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement*>(equal[eq].Element());
                intel->AdjustIntegrationRule();
            }
        }
        
        int neworder = prevorder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            neworder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		if(neworder != prevorder) {
            this->AdjustIntegrationRule();
		}
	}
}